

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeNext(sqlite3_vtab_cursor *pVtabCursor)

{
  int iVar1;
  
  if (*(char *)((long)&pVtabCursor[1].pVtab + 2) != '\0') {
    *(undefined1 *)((long)&pVtabCursor[1].pVtab + 2) = 0;
    sqlite3_reset((sqlite3_stmt *)pVtabCursor[7].pVtab);
  }
  rtreeSearchPointPop((RtreeCursor *)pVtabCursor);
  iVar1 = rtreeStepToLeaf((RtreeCursor *)pVtabCursor);
  return iVar1;
}

Assistant:

static int rtreeNext(sqlite3_vtab_cursor *pVtabCursor){
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  int rc = SQLITE_OK;

  /* Move to the next entry that matches the configured constraints. */
  RTREE_QUEUE_TRACE(pCsr, "POP-Nx:");
  if( pCsr->bAuxValid ){
    pCsr->bAuxValid = 0;
    sqlite3_reset(pCsr->pReadAux);
  }
  rtreeSearchPointPop(pCsr);
  rc = rtreeStepToLeaf(pCsr);
  return rc;
}